

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
          (VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *this,
          size_t newCount)

{
  VkMappedMemoryRange *__dest;
  ulong uVar1;
  ulong count;
  
  if (this->m_Capacity < newCount) {
    uVar1 = this->m_Capacity * 3;
    count = 8;
    if (0xf < uVar1) {
      count = uVar1 >> 1;
    }
    if (count <= newCount) {
      count = newCount;
    }
    __dest = VmaAllocateArray<VkMappedMemoryRange>((this->m_Allocator).m_pCallbacks,count);
    uVar1 = this->m_Count;
    if (uVar1 != 0) {
      if (newCount <= uVar1) {
        uVar1 = newCount;
      }
      memcpy(__dest,this->m_pArray,uVar1 * 0x28);
    }
    VmaFree((this->m_Allocator).m_pCallbacks,this->m_pArray);
    this->m_Capacity = count;
    this->m_pArray = __dest;
  }
  this->m_Count = newCount;
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::resize(size_t newCount)
{
    size_t newCapacity = m_Capacity;
    if (newCount > m_Capacity)
    {
        newCapacity = VMA_MAX(newCount, VMA_MAX(m_Capacity * 3 / 2, (size_t)8));
    }

    if (newCapacity != m_Capacity)
    {
        T* const newArray = newCapacity ? VmaAllocateArray<T>(m_Allocator.m_pCallbacks, newCapacity) : VMA_NULL;
        const size_t elementsToCopy = VMA_MIN(m_Count, newCount);
        if (elementsToCopy != 0)
        {
            memcpy(newArray, m_pArray, elementsToCopy * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = newCapacity;
        m_pArray = newArray;
    }

    m_Count = newCount;
}